

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O2

void duckdb_scalar_function_set_extra_info
               (duckdb_scalar_function function,void *extra_info,duckdb_delete_callback_t destroy)

{
  ScalarFunctionInfo *pSVar1;
  
  if (extra_info != (void *)0x0 && function != (duckdb_scalar_function)0x0) {
    pSVar1 = duckdb::shared_ptr<duckdb::ScalarFunctionInfo,_true>::operator->
                       ((shared_ptr<duckdb::ScalarFunctionInfo,_true> *)(function + 0x118));
    pSVar1[2]._vptr_ScalarFunctionInfo = (_func_int **)extra_info;
    pSVar1[3]._vptr_ScalarFunctionInfo = (_func_int **)destroy;
  }
  return;
}

Assistant:

void duckdb_scalar_function_set_extra_info(duckdb_scalar_function function, void *extra_info,
                                           duckdb_delete_callback_t destroy) {
	if (!function || !extra_info) {
		return;
	}
	auto &scalar_function = GetCScalarFunction(function);
	auto &info = scalar_function.function_info->Cast<duckdb::CScalarFunctionInfo>();
	info.extra_info = reinterpret_cast<duckdb_function_info>(extra_info);
	info.delete_callback = destroy;
}